

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Slider.cxx
# Opt level: O0

void __thiscall Fl_Slider::draw(Fl_Slider *this,int X,int Y,int W,int H)

{
  uchar uVar1;
  int iVar2;
  Fl_Boxtype FVar3;
  Fl_Color FVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Fl_Slider *pFVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  int local_9c;
  int local_8c;
  int yy_1;
  int hh;
  int yy;
  int d_1;
  int d;
  Fl_Boxtype box1;
  int hsl;
  int wsl;
  int ysl;
  int xsl;
  int T;
  int S;
  int xx;
  int ww;
  double val;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  Fl_Slider *this_local;
  
  dVar9 = Fl_Valuator::minimum(&this->super_Fl_Valuator);
  dVar10 = Fl_Valuator::maximum(&this->super_Fl_Valuator);
  if ((dVar9 != dVar10) || (NAN(dVar9) || NAN(dVar10))) {
    dVar9 = Fl_Valuator::value(&this->super_Fl_Valuator);
    dVar10 = Fl_Valuator::minimum(&this->super_Fl_Valuator);
    dVar11 = Fl_Valuator::maximum(&this->super_Fl_Valuator);
    dVar12 = Fl_Valuator::minimum(&this->super_Fl_Valuator);
    _xx = (dVar9 - dVar10) / (dVar11 - dVar12);
    if (_xx <= 1.0) {
      if (_xx < 0.0) {
        _xx = 0.0;
      }
    }
    else {
      _xx = 1.0;
    }
  }
  else {
    _xx = 0.5;
  }
  iVar2 = Fl_Valuator::horizontal(&this->super_Fl_Valuator);
  local_8c = H;
  if (iVar2 != 0) {
    local_8c = W;
  }
  uVar1 = Fl_Widget::type((Fl_Widget *)this);
  if ((uVar1 == '\x03') || (uVar1 = Fl_Widget::type((Fl_Widget *)this), uVar1 == '\x02')) {
    xsl = (int)(_xx * (double)local_8c + 0.5);
    dVar9 = Fl_Valuator::minimum(&this->super_Fl_Valuator);
    dVar10 = Fl_Valuator::maximum(&this->super_Fl_Valuator);
    if (dVar9 <= dVar10) {
      T = 0;
    }
    else {
      xsl = local_8c - xsl;
      T = local_8c - xsl;
    }
  }
  else {
    xsl = (int)(*(float *)&(this->super_Fl_Valuator).field_0xa4 * (float)local_8c + 0.5);
    iVar2 = Fl_Valuator::horizontal(&this->super_Fl_Valuator);
    local_9c = W;
    if (iVar2 != 0) {
      local_9c = H;
    }
    ysl = local_9c / 2 + 1;
    uVar1 = Fl_Widget::type((Fl_Widget *)this);
    if ((uVar1 == '\x04') || (uVar1 = Fl_Widget::type((Fl_Widget *)this), uVar1 == '\x05')) {
      ysl = local_9c / 2 + 5;
    }
    if (xsl < ysl) {
      xsl = ysl;
    }
    T = (int)(_xx * (double)(local_8c - xsl) + 0.5);
  }
  iVar2 = Fl_Valuator::horizontal(&this->super_Fl_Valuator);
  if (iVar2 == 0) {
    hsl = Y + T;
    d = xsl;
    box1 = W;
    wsl = X;
  }
  else {
    wsl = X + T;
    box1 = xsl;
    d = H;
    hsl = Y;
  }
  draw_bg(this,X,Y,W,H);
  d_1 = slider(this);
  if (d_1 == FL_NO_BOX) {
    FVar3 = Fl_Widget::box((Fl_Widget *)this);
    d_1 = FVar3 & ~FL_FLAT_BOX;
    if (d_1 == FL_NO_BOX) {
      d_1 = 2;
    }
  }
  uVar1 = Fl_Widget::type((Fl_Widget *)this);
  if (uVar1 == '\x04') {
    Fl_Widget::draw_box((Fl_Widget *)this,d_1,wsl,hsl,box1,d,0x31);
    iVar2 = (d + -4) / 2;
    FVar4 = Fl_Widget::selection_color((Fl_Widget *)this);
    Fl_Widget::draw_box((Fl_Widget *)this,FL_THIN_DOWN_BOX,wsl + 2,hsl + iVar2,box1 - FL_UP_FRAME,
                        d + iVar2 * -2,FVar4);
  }
  else {
    uVar1 = Fl_Widget::type((Fl_Widget *)this);
    if (uVar1 == '\x05') {
      Fl_Widget::draw_box((Fl_Widget *)this,d_1,wsl,hsl,box1,d,0x31);
      iVar2 = (int)(box1 - FL_UP_FRAME) / 2;
      FVar4 = Fl_Widget::selection_color((Fl_Widget *)this);
      Fl_Widget::draw_box((Fl_Widget *)this,FL_THIN_DOWN_BOX,wsl + iVar2,hsl + 2,box1 + iVar2 * -2,
                          d + -4,FVar4);
    }
    else {
      if ((0 < (int)box1) && (0 < d)) {
        FVar4 = Fl_Widget::selection_color((Fl_Widget *)this);
        Fl_Widget::draw_box((Fl_Widget *)this,d_1,wsl,hsl,box1,d,FVar4);
      }
      uVar1 = Fl_Widget::type((Fl_Widget *)this);
      if (((uVar1 != '\x03') && (uVar1 = Fl_Widget::type((Fl_Widget *)this), uVar1 != '\x02')) &&
         (iVar2 = Fl::is_scheme("gtk+"), iVar2 != 0)) {
        if ((H < W) && (d + 8 < (int)box1)) {
          iVar2 = d + -8;
          iVar5 = wsl + (int)((box1 - d) + -4) / 2;
          iVar6 = hsl + 3;
          FVar4 = Fl_Widget::selection_color((Fl_Widget *)this);
          FVar4 = fl_darker(FVar4);
          fl_color(FVar4);
          fl_line(iVar5,iVar6 + iVar2,iVar5 + iVar2,iVar6);
          fl_line(iVar5 + 6,iVar6 + iVar2,iVar5 + iVar2 + 6,iVar6);
          fl_line(iVar5 + 0xc,iVar6 + iVar2,iVar5 + iVar2 + 0xc,iVar6);
          iVar7 = iVar5 + 1;
          FVar4 = Fl_Widget::selection_color((Fl_Widget *)this);
          FVar4 = fl_lighter(FVar4);
          fl_color(FVar4);
          fl_line(iVar7,iVar6 + iVar2,iVar7 + iVar2,iVar6);
          fl_line(iVar5 + 7,iVar6 + iVar2,iVar7 + iVar2 + 6,iVar6);
          fl_line(iVar5 + 0xd,iVar6 + iVar2,iVar7 + iVar2 + 0xc,iVar6);
        }
        else if ((W < H) && ((int)(box1 + FL_THIN_UP_FRAME) < d)) {
          iVar2 = wsl + 4;
          iVar5 = box1 - FL_THIN_UP_FRAME;
          iVar6 = hsl + (int)((d - box1) + -4) / 2;
          FVar4 = Fl_Widget::selection_color((Fl_Widget *)this);
          FVar4 = fl_darker(FVar4);
          fl_color(FVar4);
          fl_line(iVar2,iVar6 + iVar5,iVar2 + iVar5,iVar6);
          fl_line(iVar2,iVar6 + iVar5 + 6,iVar2 + iVar5,iVar6 + 6);
          fl_line(iVar2,iVar6 + iVar5 + 0xc,iVar2 + iVar5,iVar6 + 0xc);
          iVar7 = iVar6 + 1;
          FVar4 = Fl_Widget::selection_color((Fl_Widget *)this);
          FVar4 = fl_lighter(FVar4);
          fl_color(FVar4);
          fl_line(iVar2,iVar7 + iVar5,iVar2 + iVar5,iVar7);
          fl_line(iVar2,iVar7 + iVar5 + 6,iVar2 + iVar5,iVar6 + 7);
          fl_line(iVar2,iVar7 + iVar5 + 0xc,iVar2 + iVar5,iVar6 + 0xd);
        }
      }
    }
  }
  Fl_Widget::draw_label((Fl_Widget *)this,wsl,hsl,box1,d);
  pFVar8 = (Fl_Slider *)Fl::focus();
  if (pFVar8 == this) {
    uVar1 = Fl_Widget::type((Fl_Widget *)this);
    if ((uVar1 == '\x03') || (uVar1 = Fl_Widget::type((Fl_Widget *)this), uVar1 == '\x02')) {
      Fl_Widget::draw_focus((Fl_Widget *)this);
    }
    else {
      Fl_Widget::draw_focus((Fl_Widget *)this,d_1,wsl,hsl,box1,d);
    }
  }
  return;
}

Assistant:

void Fl_Slider::draw(int X, int Y, int W, int H) {

  double val;
  if (minimum() == maximum())
    val = 0.5;
  else {
    val = (value()-minimum())/(maximum()-minimum());
    if (val > 1.0) val = 1.0;
    else if (val < 0.0) val = 0.0;
  }

  int ww = (horizontal() ? W : H);
  int xx, S;
  if (type()==FL_HOR_FILL_SLIDER || type() == FL_VERT_FILL_SLIDER) {
    S = int(val*ww+.5);
    if (minimum()>maximum()) {S = ww-S; xx = ww-S;}
    else xx = 0;
  } else {
    S = int(slider_size_*ww+.5);
    int T = (horizontal() ? H : W)/2+1;
    if (type()==FL_VERT_NICE_SLIDER || type()==FL_HOR_NICE_SLIDER) T += 4;
    if (S < T) S = T;
    xx = int(val*(ww-S)+.5);
  }
  int xsl, ysl, wsl, hsl;
  if (horizontal()) {
    xsl = X+xx;
    wsl = S;
    ysl = Y;
    hsl = H;
  } else {
    ysl = Y+xx;
    hsl = S;
    xsl = X;
    wsl = W;
  }

  draw_bg(X, Y, W, H);

  Fl_Boxtype box1 = slider();
  if (!box1) {box1 = (Fl_Boxtype)(box()&-2); if (!box1) box1 = FL_UP_BOX;}
  if (type() == FL_VERT_NICE_SLIDER) {
    draw_box(box1, xsl, ysl, wsl, hsl, FL_GRAY);
    int d = (hsl-4)/2;
    draw_box(FL_THIN_DOWN_BOX, xsl+2, ysl+d, wsl-4, hsl-2*d,selection_color());
  } else if (type() == FL_HOR_NICE_SLIDER) {
    draw_box(box1, xsl, ysl, wsl, hsl, FL_GRAY);
    int d = (wsl-4)/2;
    draw_box(FL_THIN_DOWN_BOX, xsl+d, ysl+2, wsl-2*d, hsl-4,selection_color());
  } else {
    if (wsl>0 && hsl>0) draw_box(box1, xsl, ysl, wsl, hsl, selection_color());

    if (type() != FL_HOR_FILL_SLIDER && type() != FL_VERT_FILL_SLIDER &&
        Fl::is_scheme("gtk+")) {
      if (W>H && wsl>(hsl+8)) {
        // Draw horizontal grippers
	int yy, hh;
	hh = hsl-8;
	xx = xsl+(wsl-hsl-4)/2;
	yy = ysl+3;

	fl_color(fl_darker(selection_color()));
	fl_line(xx, yy+hh, xx+hh, yy);
	fl_line(xx+6, yy+hh, xx+hh+6, yy);
	fl_line(xx+12, yy+hh, xx+hh+12, yy);

        xx++;
	fl_color(fl_lighter(selection_color()));
	fl_line(xx, yy+hh, xx+hh, yy);
	fl_line(xx+6, yy+hh, xx+hh+6, yy);
	fl_line(xx+12, yy+hh, xx+hh+12, yy);
      } else if (H>W && hsl>(wsl+8)) {
        // Draw vertical grippers
	int yy;
	xx = xsl+4;
	ww = wsl-8;
	yy = ysl+(hsl-wsl-4)/2;

	fl_color(fl_darker(selection_color()));
	fl_line(xx, yy+ww, xx+ww, yy);
	fl_line(xx, yy+ww+6, xx+ww, yy+6);
	fl_line(xx, yy+ww+12, xx+ww, yy+12);

        yy++;
	fl_color(fl_lighter(selection_color()));
	fl_line(xx, yy+ww, xx+ww, yy);
	fl_line(xx, yy+ww+6, xx+ww, yy+6);
	fl_line(xx, yy+ww+12, xx+ww, yy+12);
      }
    }
  }

  draw_label(xsl, ysl, wsl, hsl);
  if (Fl::focus() == this) {
    if (type() == FL_HOR_FILL_SLIDER || type() == FL_VERT_FILL_SLIDER) draw_focus();
    else draw_focus(box1, xsl, ysl, wsl, hsl);
  }
}